

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-xref.c
# Opt level: O1

void ensure_solid_xref(hd_context *ctx,pdf_document *doc,int num,int which)

{
  char *pcVar1;
  undefined8 *puVar2;
  hd_buffer **pphVar3;
  hd_error_stack_slot *phVar4;
  pdf_xref_subsec *ppVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pdf_obj *ppVar8;
  int iVar9;
  pdf_xref_subsec *ppVar10;
  pdf_xref_entry *ppVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  pdf_xref_subsec *p;
  pdf_xref *ppVar15;
  
  ppVar15 = doc->xref_sections;
  ppVar10 = ppVar15[which].subsec;
  if (num < ppVar15[which].num_objects) {
    num = ppVar15[which].num_objects;
  }
  if ((((ppVar10 == (pdf_xref_subsec *)0x0) || (ppVar10->next != (pdf_xref_subsec *)0x0)) ||
      (ppVar10->start != 0)) || (ppVar10->len < num)) {
    ppVar10 = (pdf_xref_subsec *)hd_calloc(ctx,1,0x18);
    iVar9 = hd_push_try(ctx);
    if ((iVar9 != 0) && (iVar9 = __sigsetjmp(ctx->error->top->buffer,0), iVar9 == 0)) {
      ppVar11 = (pdf_xref_entry *)hd_calloc(ctx,(long)num,0x20);
      ppVar10->table = ppVar11;
      ppVar10->start = 0;
      ppVar10->len = num;
      ppVar10->next = (pdf_xref_subsec *)0x0;
    }
    phVar4 = ctx->error->top;
    ctx->error->top = phVar4 + -1;
    if (1 < phVar4->code) {
      hd_free(ctx,ppVar10);
      hd_rethrow(ctx);
    }
    ppVar15 = ppVar15 + which;
    if (ppVar15->subsec != (pdf_xref_subsec *)0x0) {
      p = ppVar15->subsec;
      do {
        ppVar5 = p->next;
        lVar12 = 0;
        lVar13 = 0;
        if (0 < p->len) {
          do {
            ppVar11 = ppVar10->table;
            lVar14 = p->start + lVar13;
            pcVar1 = &p->table->type + lVar12;
            uVar6 = *(undefined8 *)pcVar1;
            uVar7 = *(undefined8 *)(pcVar1 + 8);
            puVar2 = (undefined8 *)((long)&p->table->stm_buf + lVar12);
            ppVar8 = (pdf_obj *)puVar2[1];
            pphVar3 = &ppVar11[lVar14].stm_buf;
            *pphVar3 = (hd_buffer *)*puVar2;
            pphVar3[1] = (hd_buffer *)ppVar8;
            ppVar11 = ppVar11 + lVar14;
            *(undefined8 *)ppVar11 = uVar6;
            *(undefined8 *)&ppVar11->ofs = uVar7;
            lVar13 = lVar13 + 1;
            lVar12 = lVar12 + 0x20;
          } while (lVar13 < p->len);
        }
        hd_free(ctx,p->table);
        hd_free(ctx,p);
        p = ppVar5;
      } while (ppVar5 != (pdf_xref_subsec *)0x0);
    }
    ppVar15->num_objects = num;
    ppVar15->subsec = ppVar10;
    if (doc->max_xref_len < num) {
      extend_xref_index(ctx,doc,num);
    }
  }
  return;
}

Assistant:

static void
ensure_solid_xref(hd_context *ctx, pdf_document *doc, int num, int which)
{
	pdf_xref *xref = &doc->xref_sections[which];
	pdf_xref_subsec *sub = xref->subsec;
	pdf_xref_subsec *new_sub;

	if (num < xref->num_objects)
		num = xref->num_objects;

	if (sub != NULL && sub->next == NULL && sub->start == 0 && sub->len >= num)
		return;

	new_sub = hd_malloc_struct(ctx, pdf_xref_subsec);
	hd_try(ctx)
	{
		new_sub->table = hd_calloc(ctx, num, sizeof(pdf_xref_entry));
		new_sub->start = 0;
		new_sub->len = num;
		new_sub->next = NULL;
	}
	hd_catch(ctx)
	{
		hd_free(ctx, new_sub);
		hd_rethrow(ctx);
	}

	/* Move objects over to the new subsection and destroy the old
	 * ones */
	sub = xref->subsec;
	while (sub != NULL)
	{
		pdf_xref_subsec *next = sub->next;
		int i;

		for (i = 0; i < sub->len; i++)
		{
			new_sub->table[i+sub->start] = sub->table[i];
		}
		hd_free(ctx, sub->table);
		hd_free(ctx, sub);
		sub = next;
	}
	xref->num_objects = num;
	xref->subsec = new_sub;
	if (doc->max_xref_len < num)
		extend_xref_index(ctx, doc, num);
}